

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestCase *
vkt::createFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function initPrograms,
          Function testFunction,InstanceContext *arg0)

{
  InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
  *this;
  FunctionPrograms1<vkt::SpirVAssembly::InstanceContext> local_200;
  InstanceContext local_1f8;
  Args local_118;
  
  this = (InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
          *)operator_new(0x160);
  local_200.m_func = initPrograms;
  SpirVAssembly::InstanceContext::InstanceContext(&local_1f8,arg0);
  local_118.func = testFunction;
  SpirVAssembly::InstanceContext::InstanceContext(&local_118.arg0,&local_1f8);
  InstanceFactory1<vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>,_vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::Args,_vkt::FunctionPrograms1<vkt::SpirVAssembly::InstanceContext>_>
  ::InstanceFactory1(this,testCtx,type,name,desc,&local_200,&local_118);
  SpirVAssembly::InstanceContext::~InstanceContext(&local_118.arg0);
  SpirVAssembly::InstanceContext::~InstanceContext(&local_1f8);
  return &this->super_TestCase;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}